

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdConvert<wabt::interp::Simd<double,(unsigned_char)2>,wabt::interp::Simd<float,(unsigned_char)4>,true>
          (Thread *this)

{
  Simd<double,_(unsigned_char)__x02_> value;
  float *pfVar1;
  double *pdVar2;
  double dVar3;
  byte local_31;
  undefined1 auStack_30 [7];
  u8 i;
  Simd<double,_(unsigned_char)__x02_> result;
  Simd<float,_(unsigned_char)__x04_> val;
  Thread *this_local;
  
  join_0x00001240_0x00001200_ = Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  for (local_31 = 0; local_31 < 2; local_31 = local_31 + 1) {
    pfVar1 = Simd<float,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<float,_(unsigned_char)__x04_> *)(result.v + 1),local_31);
    dVar3 = Convert<double,float>(*pfVar1);
    pdVar2 = Simd<double,_(unsigned_char)'\x02'>::operator[]
                       ((Simd<double,_(unsigned_char)__x02_> *)auStack_30,local_31);
    *pdVar2 = dVar3;
  }
  value.v[1] = result.v[0];
  value.v[0] = _auStack_30;
  Push<wabt::interp::Simd<double,(unsigned_char)2>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdConvert() {
  using SL = typename S::LaneType;
  auto val = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = Convert<SL>(val[(low ? 0 : S::lanes) + i]);
  }
  Push(result);
  return RunResult::Ok;
}